

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O0

void __thiscall
Eigen::internal::
permut_matrix_product_retval<Eigen::PermutationMatrix<-1,-1,int>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>,1,false>
::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (permut_matrix_product_retval<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,_false>
           *this,Matrix<double,__1,__1,_0,__1,__1> *dst)

{
  Index IVar1;
  DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>
  *in_RSI;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *in_RDI;
  int i;
  Scalar *dst_data;
  Index n;
  DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>
  *other;
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  *in_stack_ffffffffffffff78;
  Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>
  *in_stack_ffffffffffffff80;
  int local_24;
  
  IVar1 = permut_matrix_product_retval<Eigen::PermutationMatrix<-1,_-1,_int>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_false>
          ::rows((permut_matrix_product_retval<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,_false>
                  *)0x2dc339);
  extract_data<Eigen::Matrix<double,_1,_1,0,_1,_1>>((Matrix<double,__1,__1,_0,__1,__1> *)0x2dc34e);
  for (local_24 = 0; local_24 < IVar1; local_24 = local_24 + 1) {
    Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>
    ::Block(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(Index)in_RDI);
    other = in_RSI;
    PermutationMatrix<-1,_-1,_int>::indices
              ((PermutationMatrix<_1,__1,_int> *)
               (in_RDI->
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
               ).super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
               .m_data);
    PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::coeff
              ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)in_RDI,(Index)other);
    Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
               in_stack_ffffffffffffff80,
               (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffff78,(Index)in_RDI);
    Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=(in_RDI,other);
  }
  return;
}

Assistant:

inline void evalTo(Dest& dst) const
    {
      const Index n = Side==OnTheLeft ? rows() : cols();
      // FIXME we need an is_same for expression that is not sensitive to constness. For instance
      // is_same_xpr<Block<const Matrix>, Block<Matrix> >::value should be true.
      const typename Dest::Scalar *dst_data = internal::extract_data(dst);
      if(    is_same<MatrixTypeNestedCleaned,Dest>::value
          && blas_traits<MatrixTypeNestedCleaned>::HasUsableDirectAccess
          && blas_traits<Dest>::HasUsableDirectAccess
          && dst_data!=0 && dst_data == extract_data(m_matrix))
      {
        // apply the permutation inplace
        Matrix<bool,PermutationType::RowsAtCompileTime,1,0,PermutationType::MaxRowsAtCompileTime> mask(m_permutation.size());
        mask.fill(false);
        Index r = 0;
        while(r < m_permutation.size())
        {
          // search for the next seed
          while(r<m_permutation.size() && mask[r]) r++;
          if(r>=m_permutation.size())
            break;
          // we got one, let's follow it until we are back to the seed
          Index k0 = r++;
          Index kPrev = k0;
          mask.coeffRef(k0) = true;
          for(Index k=m_permutation.indices().coeff(k0); k!=k0; k=m_permutation.indices().coeff(k))
          {
                  Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>(dst, k)
            .swap(Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>
                       (dst,((Side==OnTheLeft) ^ Transposed) ? k0 : kPrev));

            mask.coeffRef(k) = true;
            kPrev = k;
          }
        }
      }
      else
      {
        for(int i = 0; i < n; ++i)
        {
          Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>
               (dst, ((Side==OnTheLeft) ^ Transposed) ? m_permutation.indices().coeff(i) : i)

          =

          Block<const MatrixTypeNestedCleaned,Side==OnTheLeft ? 1 : MatrixType::RowsAtCompileTime,Side==OnTheRight ? 1 : MatrixType::ColsAtCompileTime>
               (m_matrix, ((Side==OnTheRight) ^ Transposed) ? m_permutation.indices().coeff(i) : i);
        }
      }
    }